

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemeReference.cpp
# Opt level: O3

void __thiscall
references::scheme::environment::environment
          (environment *this,cells *parms,cells *args,environment *outer)

{
  _Rb_tree_header *p_Var1;
  environment *peVar2;
  mapped_type *pmVar3;
  pointer pcVar4;
  pointer pcVar5;
  
  p_Var1 = &(this->env_)._M_t._M_impl.super__Rb_tree_header;
  (this->env_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->env_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->env_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->env_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->env_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->outer_ = outer;
  pcVar4 = (parms->
           super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if (pcVar4 != (parms->
                super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    pcVar5 = (args->
             super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>
             )._M_impl.super__Vector_impl_data._M_start;
    do {
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell>_>_>
               ::operator[](&this->env_,&pcVar4->val);
      pmVar3->type = pcVar5->type;
      std::__cxx11::string::_M_assign((string *)&pmVar3->val);
      std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>::operator=
                (&pmVar3->list,&pcVar5->list);
      peVar2 = pcVar5->env;
      pmVar3->proc = pcVar5->proc;
      pmVar3->env = peVar2;
      pcVar4 = pcVar4 + 1;
      pcVar5 = pcVar5 + 1;
    } while (pcVar4 != (parms->
                       super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

environment(const cells & parms, const cells & args, environment * outer)
		: outer_(outer)
	{
		cellit a = args.begin();
		for (cellit p = parms.begin(); p != parms.end(); ++p)
			env_[p->val] = *a++;
	}